

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  char cVar1;
  zip *zip_00;
  int iVar2;
  wchar_t wVar3;
  int64_t iVar4;
  void *pvVar5;
  int64_t local_58;
  wchar_t ret_1;
  wchar_t ret;
  wchar_t tail;
  wchar_t i;
  char *p;
  int64_t current_offset;
  int64_t file_size;
  zip *zip;
  wchar_t best_bid_local;
  archive_read *a_local;
  
  zip_00 = (zip *)a->format->data;
  if (best_bid < L'!') {
    local_58 = __archive_read_seek(a,0,2);
    if (local_58 < 1) {
      a_local._4_4_ = L'\0';
    }
    else {
      if (0x4000 < local_58) {
        local_58 = 0x4000;
      }
      iVar2 = (int)local_58;
      iVar4 = __archive_read_seek(a,(long)-iVar2,2);
      if (iVar4 < 0) {
        a_local._4_4_ = L'\0';
      }
      else {
        pvVar5 = __archive_read_ahead(a,(long)iVar2,(ssize_t *)0x0);
        if (pvVar5 == (void *)0x0) {
          a_local._4_4_ = L'\0';
        }
        else {
          ret = L'\0';
          while (ret <= iVar2 + L'\xffffffea') {
            cVar1 = *(char *)((long)ret + 3 + (long)pvVar5);
            if (cVar1 == '\x05') {
              ret = ret + L'\x01';
            }
            else if (cVar1 == '\x06') {
              if ((*(int *)((long)pvVar5 + (long)ret) == 0x6054b50) &&
                 (wVar3 = read_eocd(zip_00,(char *)((long)pvVar5 + (long)ret),iVar4 + ret),
                 L'\0' < wVar3)) {
                return wVar3;
              }
              ret = ret + L'\x01';
            }
            else if (cVar1 == '\a') {
              if ((*(int *)((long)pvVar5 + (long)ret) == 0x7064b50) &&
                 (wVar3 = read_zip64_eocd(a,zip_00,(char *)((long)pvVar5 + (long)ret)),
                 L'\0' < wVar3)) {
                return wVar3;
              }
              ret = ret + L'\x04';
            }
            else if (cVar1 == 'K') {
              ret = ret + L'\x02';
            }
            else if (cVar1 == 'P') {
              ret = ret + L'\x03';
            }
            else {
              ret = ret + L'\x04';
            }
          }
          a_local._4_4_ = L'\0';
        }
      }
    }
  }
  else {
    a_local._4_4_ = L'\xffffffff';
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) or Zip64 locator
	 * record (which begins with PK\006\007) */
	tail = zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* TODO: Rework this to search backwards from the end.  We
	 * normally expect the EOCD record to be at the very end, so
	 * that should be significantly faster.  Tricky part: Make
	 * sure we still prefer the Zip64 locator if it's present. */
	for (i = 0; i <= tail - 22;) {
		switch (p[i + 3]) {
		case 'P': i += 3; break;
		case 'K': i += 2; break;
		case 005: i += 1; break;
		case 006:
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i, current_offset + i);
				if (ret > 0)
					return (ret);
			}
			i += 1; /* Look for PK\006\007 next */
			break;
		case 007:
			if (memcmp(p + i, "PK\006\007", 4) == 0) {
				int ret = read_zip64_eocd(a, zip, p + i);
				if (ret > 0)
					return (ret);
			}
			i += 4;
			break;
		default: i += 4; break;
		}
	}
	return 0;
}